

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortestPathTN93.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__filename;
  int iVar1;
  char resolutionOption;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  FILE *pFVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  unsigned_long theSequence;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  char automatonState;
  FILE *local_80;
  long firstSequenceLength;
  char **local_70;
  double local_68;
  ulong local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (argc < 9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Usage is `");
    poVar8 = std::operator<<(poVar8,Usage);
    poVar8 = std::operator<<(poVar8,"\'.");
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(1);
  }
  pcVar9 = argv[1];
  firstSequenceLength = 0;
  iVar3 = atoi(argv[4]);
  if (iVar3 < 1) {
    pcVar9 = "Minimum overlap must be a positive integer";
    lVar11 = 0x2a;
  }
  else {
    if ((*pcVar9 != '-') || (pFVar6 = _stdin, pcVar9[1] != '\0')) {
      pFVar6 = fopen(pcVar9,"r");
    }
    __filename = argv[2];
    if ((*__filename != '-') || (pFVar7 = _stdout, __filename[1] != '\0')) {
      pFVar7 = fopen(__filename,"w");
    }
    if (pFVar6 != (FILE *)0x0) {
      if (pFVar7 != (FILE *)0x0) {
        pcVar9 = argv[3];
        iVar4 = strcmp(pcVar9,"GAPMM");
        local_80 = pFVar7;
        local_70 = argv;
        local_60 = (ulong)(uint)argc;
        if (iVar4 == 0) {
          resolutionOption = '\x03';
        }
        else {
          iVar4 = strcmp(pcVar9,"AVERAGE");
          if (iVar4 == 0) {
            resolutionOption = '\x01';
          }
          else {
            iVar4 = strcmp(pcVar9,"SKIP");
            resolutionOption = (iVar4 == 0) * '\x02';
          }
        }
        automatonState = '\0';
        Vector::appendValue(&nameLengths,0);
        Vector::appendValue(&seqLengths,0);
        initAlphabets(false,(char *)0x0,false);
        iVar4 = readFASTA((FILE *)pFVar6,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                          &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
        if (iVar4 == 1) {
          return 1;
        }
        fclose(pFVar6);
        uVar12 = seqLengths.vLength - 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," sequences of length ",0x15);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        ppcVar2 = local_70;
        iVar4 = atoi(local_70[5]);
        uVar13 = (ulong)iVar4;
        if (uVar13 < uVar12) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Using ",6);
          pcVar9 = stringText(&names,&nameLengths,uVar13);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d1f0);
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," as the source",0xe);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          initializeSingleSource(uVar12,uVar13);
          local_68 = atof(ppcVar2[7]);
          if (0.0 < local_68) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Using step penalty of ",0x16);
            poVar8 = std::ostream::_M_insert<double>(local_68);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if (workingNodes.vLength != 0) {
              auVar15._8_4_ = (int)(uVar12 >> 0x20);
              auVar15._0_8_ = uVar12;
              auVar15._12_4_ = 0x45300000;
              dVar14 = 100.0 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0));
              dVar18 = 0.0;
              dVar19 = 0.0;
              do {
                local_48 = -dVar18;
                dStack_40 = -dVar19;
                local_58 = dVar18;
                dStack_50 = dVar19;
                do {
                  theSequence = Vector::extractMin(&workingNodes,&distanceEstimates);
                  relaxDistanceEstimates
                            (theSequence,firstSequenceLength,resolutionOption,(long)iVar3,local_68);
                  lVar11 = uVar12 - workingNodes.vLength;
                  auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
                  auVar16._0_8_ = lVar11;
                  auVar16._12_4_ = 0x45300000;
                  if (0.1 < ((auVar16._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                            dVar14 + local_48) break;
                } while (workingNodes.vLength != 0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b",0x20);
                *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
                poVar8 = std::ostream::_M_insert<double>(local_58);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"% done ",7);
                lVar11 = uVar12 - workingNodes.vLength;
                auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
                auVar17._0_8_ = lVar11;
                auVar17._12_4_ = 0x45300000;
                dVar19 = auVar17._8_8_ - 1.9342813113834067e+25;
                dVar18 = (dVar19 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))
                         * dVar14;
              } while (workingNodes.vLength != 0);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            iVar4 = strcmp(local_70[6],"JSON");
            if (iVar4 == 0) {
              fwrite("\n{\n",3,1,local_80);
            }
            iVar1 = (int)local_60;
            uVar12 = local_60 & 0xffffffff;
            uVar13 = 8;
            do {
              iVar5 = atoi(local_70[uVar13]);
              reportPathToSource((long)iVar5,(FILE *)local_80,iVar4 == 0,firstSequenceLength,
                                 resolutionOption,(long)iVar3,local_68);
              if (iVar4 == 0 && uVar13 < iVar1 - 1) {
                fwrite(",\n",2,1,local_80);
              }
              pFVar6 = local_80;
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
            if (iVar4 == 0) {
              fwrite("\n}\n",3,1,local_80);
            }
            if (pFVar6 == _stdout) {
              return 0;
            }
            fclose(pFVar6);
            return 0;
          }
          pcVar9 = "Invalid step penalty";
          lVar11 = 0x14;
        }
        else {
          pcVar9 = "Invalid source sequence index";
          lVar11 = 0x1d;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar11);
        return 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot open file `",0x12);
      poVar8 = std::ostream::_M_insert<void_const*>(&std::cerr);
      pcVar9 = "\'.";
      lVar11 = 2;
      goto LAB_00103b74;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot open file `",0x12);
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar10);
    pcVar9 = "\'.";
    lVar11 = 2;
  }
  poVar8 = (ostream *)&std::cerr;
LAB_00103b74:
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,lVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return 1;
}

Assistant:

int main (int argc, const char * argv[])
{
    if (argc < 9)
    {
        cerr << "Usage is `" << Usage << "'." << endl;
        exit(1);
    }

    const    char *S = argv[1];

    long     firstSequenceLength = 0,
             min_overlap = 1;


    /*if (distanceThreshold > 0.)
    	min_overlap = 1./distanceThreshold;*/

    min_overlap = atoi (argv[4]);
    if (min_overlap < 1) {
        cerr << "Minimum overlap must be a positive integer" << endl;
        return 1;
    }


    FILE *F  = strcmp (S,"-") == 0 ? stdin: fopen(S, "r"),
          *FO = strcmp (argv[2],"-") == 0? stdout: fopen (argv[2], "w");

    if (F == NULL) {
        cerr << "Cannot open file `" << S << "'." << endl;
        return 1;
    }

    if (FO == NULL) {
        cerr << "Cannot open file `" << FO << "'." << endl;
        return 1;
    }

    char resolutionOption = RESOLVE;

    if (strcmp (argv[3], "GAPMM") == 0) {
        resolutionOption = GAPMM;
    } else if (strcmp (argv[3], "AVERAGE") == 0) {
        resolutionOption = AVERAGE;
    } else if (strcmp (argv[3], "SKIP") == 0) {
        resolutionOption = SKIP;
    }




    char automatonState = 0;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence

    nameLengths.appendValue (0);
    seqLengths.appendValue (0);
    initAlphabets ();

    if (readFASTA (F, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength) == 1)
        return 1;

    fclose(F);

    unsigned long sequenceCount = seqLengths.length()-1;

    cerr << "Read " << sequenceCount << " sequences of length " << firstSequenceLength << endl ;

    unsigned long source = atoi (argv[5]);
    if (source < 0 || source >= sequenceCount) {
        cerr << "Invalid source sequence index";
        return 1;
    } else {
        cerr << "Using " << stringText (names, nameLengths, source) << " as the source" << endl;
    }

    initializeSingleSource (sequenceCount, source);

    double percentDone = 0.0,
           normalizer  = 100./sequenceCount,
           step_penalty = 10.;

    step_penalty = atof (argv[7]);
    if (step_penalty <= 0.0) {
        cerr << "Invalid step penalty";
        return 1;
    } else {
        cerr << "Using step penalty of " << step_penalty << endl;
    }

    while (workingNodes.length()) {
        unsigned long add_this_node = workingNodes.extractMin (distanceEstimates);
        relaxDistanceEstimates (add_this_node,firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if ((sequenceCount-workingNodes.length()) * normalizer - percentDone > 0.1 || workingNodes.length () == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << percentDone << "% done ";
            percentDone = (sequenceCount-workingNodes.length()) * normalizer;
        }
    }
    cerr << endl;

    bool is_json = strcmp (argv[6],"JSON") == 0;

    if (is_json) {
        fprintf (FO, "\n{\n");
    }

    for (long which_arg = 8; which_arg < argc; which_arg ++) {
        reportPathToSource (atoi (argv[which_arg]),FO, is_json, firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if (is_json && which_arg < argc - 1) {
            fprintf (FO, ",\n");
        }
    }

    if (is_json) {
        fprintf (FO, "\n}\n");
    }

    if (FO != stdout)
        fclose (FO);
    return 0;

}